

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O0

void __thiscall
duckdb::ChunkVectorInfo::CommitAppend
          (ChunkVectorInfo *this,transaction_t commit_id,idx_t start,idx_t end)

{
  idx_t i;
  idx_t end_local;
  idx_t start_local;
  transaction_t commit_id_local;
  ChunkVectorInfo *this_local;
  
  i = start;
  if ((this->same_inserted_id & 1U) != 0) {
    this->insert_id = commit_id;
  }
  for (; i < end; i = i + 1) {
    this->inserted[i] = commit_id;
  }
  return;
}

Assistant:

void ChunkVectorInfo::CommitAppend(transaction_t commit_id, idx_t start, idx_t end) {
	if (same_inserted_id) {
		insert_id = commit_id;
	}
	for (idx_t i = start; i < end; i++) {
		inserted[i] = commit_id;
	}
}